

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::clara::TextFlow::Column::iterator::calcLength(iterator *this)

{
  ulong uVar1;
  Column *pCVar2;
  pointer pbVar3;
  ulong uVar4;
  bool bVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  
  pCVar2 = this->m_column;
  if ((ulong)((long)(pCVar2->m_strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar2->m_strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) <= this->m_stringIndex) {
    __assert_fail("m_stringIndex < m_column.m_strings.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pyxll[P]xlfparser/tests/catch.hpp"
                  ,0x1913,"void Catch::clara::TextFlow::Column::iterator::calcLength()");
  }
  this->m_suffix = false;
  sVar7 = pCVar2->m_width;
  sVar6 = indent(this);
  sVar7 = sVar7 - sVar6;
  sVar6 = this->m_pos;
  pbVar3 = (this->m_column->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = *(size_type *)((long)(pbVar3 + this->m_stringIndex) + 8);
  sVar8 = 0;
  while( true ) {
    uVar1 = sVar6 + sVar8;
    this->m_end = uVar1;
    if ((uVar4 <= uVar1) ||
       (*(char *)(sVar8 + *(long *)&pbVar3[this->m_stringIndex]._M_dataplus + sVar6) == '\n'))
    break;
    sVar8 = sVar8 + 1;
  }
  sVar9 = sVar7;
  if (sVar6 + sVar7 <= uVar1) {
    do {
      sVar6 = sVar9;
      if (sVar9 == 0) break;
      bVar5 = isBoundary(this,this->m_pos + sVar9);
      sVar9 = sVar9 - 1;
    } while (!bVar5);
    do {
      sVar8 = sVar6;
      if (sVar8 == 0) {
        this->m_suffix = true;
        sVar8 = sVar7 - 1;
        break;
      }
      bVar5 = isWhitespace(*(char *)((sVar8 - 1) +
                                    *(long *)&(this->m_column->m_strings).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [this->m_stringIndex]._M_dataplus + this->m_pos));
      sVar6 = sVar8 - 1;
    } while (bVar5);
  }
  this->m_len = sVar8;
  return;
}

Assistant:

void calcLength() {
			assert(m_stringIndex < m_column.m_strings.size());

			m_suffix = false;
			auto width = m_column.m_width - indent();
			m_end = m_pos;
			while (m_end < line().size() && line()[m_end] != '\n')
				++m_end;

			if (m_end < m_pos + width) {
				m_len = m_end - m_pos;
			} else {
				size_t len = width;
				while (len > 0 && !isBoundary(m_pos + len))
					--len;
				while (len > 0 && isWhitespace(line()[m_pos + len - 1]))
					--len;

				if (len > 0) {
					m_len = len;
				} else {
					m_suffix = true;
					m_len = width - 1;
				}
			}
		}